

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Header6::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Header6 *this)

{
  byte bVar1;
  ostream *poVar2;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Header6 *local_18;
  Header6 *this_local;
  
  local_18 = this;
  this_local = (Header6 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"-PDU Header-\n");
  poVar2 = std::operator<<(poVar2,"Protocol Version: ");
  DATA_TYPE::ENUMS::GetEnumAsStringProtocolVersion_abi_cxx11_
            (&local_1d0,(ENUMS *)(ulong)this->m_ui8ProtocolVersion,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Exercise ID:      ");
  bVar1 = GetExerciseID(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)bVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"PDU Type:         ");
  DATA_TYPE::ENUMS::GetEnumAsStringPDUType_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)this->m_ui8PDUType,Value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Protocol Family:  ");
  DATA_TYPE::ENUMS::GetEnumAsStringProtocolFamily_abi_cxx11_
            (&local_210,(ENUMS *)(ulong)this->m_ui8ProtocolFamily,Value_01);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"\n");
  DATA_TYPE::TimeStamp::GetAsString_abi_cxx11_(&local_230,&this->m_TimeStamp);
  poVar2 = std::operator<<(poVar2,(string *)&local_230);
  poVar2 = std::operator<<(poVar2,"PDU Length:       ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16PDULength);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Header6::GetAsString() const
{
    KStringStream ss;

    ss << "-PDU Header-\n"
       << "Protocol Version: " << GetEnumAsStringProtocolVersion( m_ui8ProtocolVersion ) << "\n"
       << "Exercise ID:      " << ( KUINT16 )GetExerciseID()                             << "\n"
       << "PDU Type:         " << GetEnumAsStringPDUType( m_ui8PDUType )                 << "\n"
       << "Protocol Family:  " << GetEnumAsStringProtocolFamily( m_ui8ProtocolFamily )   << "\n"
       << m_TimeStamp.GetAsString()
       << "PDU Length:       " << m_ui16PDULength
       << "\n";

    return ss.str();
}